

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
VerifyMethodCallbackType
          (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,CALLBACK_TYPE desiredCallbackType,
          _Bool unsubscribing)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  _Bool unsubscribing_local;
  CALLBACK_TYPE desiredCallbackType_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData_local;
  
  if (unsubscribing) {
    if ((handleData->methodCallback).type == CALLBACK_TYPE_NONE) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"VerifyMethodCallbackType",0x9fb,1,
                  "not currently set to accept or process incoming messages.");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else if ((handleData->methodCallback).type == desiredCallbackType) {
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"VerifyMethodCallbackType",0xa00,1,
                  "Need to unsubscribe with same type of device method function (original or _Ex()")
        ;
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  else if (((handleData->methodCallback).type == CALLBACK_TYPE_NONE) ||
          ((handleData->methodCallback).type == desiredCallbackType)) {
    l._4_4_ = IOTHUB_CLIENT_OK;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"VerifyMethodCallbackType",0xa0e,1,
                "Need to change callback function with same type of device method function (original or _Ex()"
               );
    }
    l._4_4_ = IOTHUB_CLIENT_ERROR;
  }
  return l._4_4_;
}

Assistant:

static IOTHUB_CLIENT_RESULT VerifyMethodCallbackType(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, CALLBACK_TYPE desiredCallbackType, bool unsubscribing)
{
    IOTHUB_CLIENT_RESULT result;

    if (unsubscribing)
    {
        // If we are unsubscribing,  method (Ex or the original non-Ex) performing the unsubscribe must be the same function that subscribed initially.
        if (handleData->methodCallback.type == CALLBACK_TYPE_NONE)
        {
            LogError("not currently set to accept or process incoming messages.");
            result = IOTHUB_CLIENT_ERROR;
        }
        else if (handleData->methodCallback.type != desiredCallbackType)
        {
            LogError("Need to unsubscribe with same type of device method function (original or _Ex()");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    else
    {
        // If we are already subscribed and changing the callback method, the type of method (Ex or original non-Ex) must match what was used for the original subscribe.
        if ((handleData->methodCallback.type != CALLBACK_TYPE_NONE) &&
            (handleData->methodCallback.type != desiredCallbackType))
        {
            LogError("Need to change callback function with same type of device method function (original or _Ex()");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}